

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall p2t::Sweep::EdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  double dVar1;
  bool bVar2;
  Node *node_local;
  Edge *edge_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  (tcx->edge_event).constrained_edge = edge;
  dVar1 = edge->p->x;
  (tcx->edge_event).right = edge->q->x <= dVar1 && dVar1 != edge->q->x;
  bVar2 = IsEdgeSideOfTriangle(this,node->triangle,edge->p,edge->q);
  if (!bVar2) {
    FillEdgeEvent(this,tcx,edge,node);
    EdgeEvent(this,tcx,edge->p,edge->q,node->triangle,edge->q);
  }
  return;
}

Assistant:

void Sweep::EdgeEvent(SweepContext& tcx, Edge* edge, Node* node)
{
  tcx.edge_event.constrained_edge = edge;
  tcx.edge_event.right = (edge->p->x > edge->q->x);

  if (IsEdgeSideOfTriangle(*node->triangle, *edge->p, *edge->q)) {
    return;
  }

  // For now we will do all needed filling
  // TODO: integrate with flip process might give some better performance
  //       but for now this avoid the issue with cases that needs both flips and fills
  FillEdgeEvent(tcx, edge, node);
  EdgeEvent(tcx, *edge->p, *edge->q, node->triangle, *edge->q);
}